

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

double __thiscall pfederc::LogMessage::log(LogMessage *this,double __x)

{
  bool bVar1;
  ulong extraout_RAX;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *this_00;
  reference this_01;
  Logger *in_RSI;
  double __x_00;
  double dVar2;
  double extraout_XMM0_Qa;
  double __x_01;
  LogMessage *msg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *__range1;
  Logger *log_local;
  LogMessage *this_local;
  
  getLogLevel(this);
  getMessage_abi_cxx11_(this);
  dVar2 = Logger::log(in_RSI,__x_00);
  if ((extraout_RAX & 1) != 0) {
    this_00 = getMessages(this);
    __end1 = std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::begin(this_00);
    msg = (LogMessage *)
          std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_pfederc::LogMessage_*,_std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>_>
                                       *)&msg), dVar2 = extraout_XMM0_Qa, bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_pfederc::LogMessage_*,_std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>_>
                ::operator*(&__end1);
      log(this_01,__x_01);
      __gnu_cxx::
      __normal_iterator<const_pfederc::LogMessage_*,_std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>_>
      ::operator++(&__end1);
    }
  }
  return dVar2;
}

Assistant:

void LogMessage::log(Logger &log) const noexcept {
  if (!log.log(getLogLevel(), getMessage()))
    return;

  for (const LogMessage &msg : getMessages()) {
    msg.log(log);
  }
}